

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_read.cpp
# Opt level: O0

ssize_t __thiscall UniValue::read(UniValue *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  jtokentype jVar7;
  VType VVar8;
  char *end_00;
  reference ppUVar9;
  size_type sVar10;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  bool bVar11;
  UniValue *top_7;
  UniValue tmpVal_3;
  UniValue *top_6;
  UniValue *top_5;
  UniValue tmpVal_2;
  UniValue *top_4;
  UniValue tmpVal_1;
  UniValue *top_3;
  UniValue *top_2;
  UniValue *top_1;
  reference pvStack_130;
  VType utyp_1;
  UniValue *newTop;
  UniValue *top;
  string local_118;
  undefined1 local_f8 [8];
  UniValue tmpVal;
  VType utyp;
  bool isObjName;
  bool isArrValue;
  bool isValueOpen;
  char *end;
  jtokentype local_70;
  jtokentype last_tok;
  jtokentype tok;
  uint consumed;
  string tokenVal;
  vector<UniValue_*,_std::allocator<UniValue_*>_> stack;
  uint32_t expectMask;
  size_t size_local;
  char *raw_local;
  UniValue *this_local;
  
  size_local = CONCAT44(in_register_00000034,__fd);
  clear(this);
  bVar5 = false;
  bVar4 = false;
  bVar3 = false;
  bVar2 = false;
  bVar1 = false;
  std::vector<UniValue_*,_std::allocator<UniValue_*>_>::vector
            ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)((long)&tokenVal.field_2 + 8));
  std::__cxx11::string::string((string *)&tok);
  local_70 = JTOK_NONE;
  end_00 = (char *)(size_local + (long)__buf);
  do {
    jVar7 = getJsonToken((string *)&tok,(uint *)&last_tok,(char *)size_local,end_00);
    if ((jVar7 == JTOK_NONE) || (jVar7 == JTOK_ERR)) {
      this_local._7_1_ = 0;
      goto LAB_00648246;
    }
    size_local = size_local + (uint)last_tok;
    bVar6 = jsonTokenIsValue(jVar7);
    bVar11 = true;
    if ((!bVar6) && (bVar11 = true, jVar7 != JTOK_OBJ_OPEN)) {
      bVar11 = jVar7 == JTOK_ARR_OPEN;
    }
    if (bVar2) {
      if (!bVar11) {
        this_local._7_1_ = 0;
        goto LAB_00648246;
      }
      bVar2 = false;
    }
    else if (bVar3) {
      if (!bVar11 && jVar7 != JTOK_ARR_CLOSE) {
        this_local._7_1_ = 0;
        goto LAB_00648246;
      }
      bVar3 = false;
    }
    else if (bVar1) {
      if (jVar7 != JTOK_OBJ_CLOSE && jVar7 != JTOK_STRING) {
        this_local._7_1_ = 0;
        goto LAB_00648246;
      }
    }
    else if (bVar4) {
      if (jVar7 != JTOK_COLON) {
        this_local._7_1_ = 0;
        goto LAB_00648246;
      }
      bVar4 = false;
    }
    else if ((!bVar4) && (jVar7 == JTOK_COLON)) {
      this_local._7_1_ = 0;
      goto LAB_00648246;
    }
    if (bVar5) {
      if (bVar11) {
        this_local._7_1_ = 0;
        goto LAB_00648246;
      }
      bVar5 = false;
    }
    switch(jVar7) {
    case JTOK_OBJ_OPEN:
    case JTOK_ARR_OPEN:
      VVar8 = VARR;
      if (jVar7 == JTOK_OBJ_OPEN) {
        VVar8 = VOBJ;
      }
      sVar10 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::size
                         ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                          ((long)&tokenVal.field_2 + 8));
      if (sVar10 == 0) {
        if (VVar8 == VOBJ) {
          setObject(this);
        }
        else {
          setArray(this);
        }
        tmpVal.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = this;
        std::vector<UniValue_*,_std::allocator<UniValue_*>_>::push_back
                  ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)((long)&tokenVal.field_2 + 8),
                   &tmpVal.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_118,"",(allocator *)((long)&top + 7));
        UniValue((UniValue *)local_f8,VVar8,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator((allocator<char> *)((long)&top + 7));
        ppUVar9 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::back
                            ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                             ((long)&tokenVal.field_2 + 8));
        newTop = *ppUVar9;
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                  (&newTop->values,(value_type *)local_f8);
        pvStack_130 = std::vector<UniValue,_std::allocator<UniValue>_>::back(&newTop->values);
        std::vector<UniValue_*,_std::allocator<UniValue_*>_>::push_back
                  ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)((long)&tokenVal.field_2 + 8),
                   &stack0xfffffffffffffed0);
        ~UniValue((UniValue *)local_f8);
      }
      if (VVar8 == VOBJ) {
        bVar1 = true;
      }
      else {
        bVar3 = true;
      }
      break;
    case JTOK_OBJ_CLOSE:
    case JTOK_ARR_CLOSE:
      sVar10 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::size
                         ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                          ((long)&tokenVal.field_2 + 8));
      if ((sVar10 == 0) || (local_70 == JTOK_COMMA)) {
        this_local._7_1_ = 0;
        goto LAB_00648246;
      }
      ppUVar9 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::back
                          ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                           ((long)&tokenVal.field_2 + 8));
      VVar8 = getType(*ppUVar9);
      if ((jVar7 != JTOK_OBJ_CLOSE) + VOBJ != VVar8) {
        this_local._7_1_ = 0;
        goto LAB_00648246;
      }
      std::vector<UniValue_*,_std::allocator<UniValue_*>_>::pop_back
                ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)((long)&tokenVal.field_2 + 8));
      bVar5 = true;
      bVar1 = false;
      break;
    case JTOK_COLON:
      sVar10 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::size
                         ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                          ((long)&tokenVal.field_2 + 8));
      if (sVar10 == 0) {
        this_local._7_1_ = 0;
        goto LAB_00648246;
      }
      ppUVar9 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::back
                          ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                           ((long)&tokenVal.field_2 + 8));
      VVar8 = getType(*ppUVar9);
      if (VVar8 != VOBJ) {
        this_local._7_1_ = 0;
        goto LAB_00648246;
      }
      bVar2 = true;
      break;
    case JTOK_COMMA:
      sVar10 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::size
                         ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                          ((long)&tokenVal.field_2 + 8));
      if (((sVar10 == 0) || (local_70 == JTOK_COMMA)) || (local_70 == JTOK_ARR_OPEN)) {
        this_local._7_1_ = 0;
        goto LAB_00648246;
      }
      ppUVar9 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::back
                          ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                           ((long)&tokenVal.field_2 + 8));
      tmpVal_1.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *ppUVar9;
      VVar8 = getType(tmpVal_1.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (VVar8 == VOBJ) {
        bVar1 = true;
      }
      else {
        bVar3 = true;
      }
      break;
    case JTOK_KW_NULL:
    case JTOK_KW_TRUE:
    case JTOK_KW_FALSE:
      UniValue((UniValue *)&top_4);
      if (jVar7 != JTOK_KW_NULL) {
        if (jVar7 == JTOK_KW_TRUE) {
          setBool((UniValue *)&top_4,true);
        }
        else if (jVar7 == JTOK_KW_FALSE) {
          setBool((UniValue *)&top_4,false);
        }
      }
      sVar10 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::size
                         ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                          ((long)&tokenVal.field_2 + 8));
      if (sVar10 == 0) {
        operator=(this,(UniValue *)&top_4);
      }
      else {
        ppUVar9 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::back
                            ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                             ((long)&tokenVal.field_2 + 8));
        tmpVal_2.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *ppUVar9;
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                  (&(tmpVal_2.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage)->values,(value_type *)&top_4);
        bVar5 = true;
      }
      ~UniValue((UniValue *)&top_4);
      break;
    case JTOK_NUMBER:
      UniValue((UniValue *)&top_5,VNUM,(string *)&tok);
      sVar10 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::size
                         ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                          ((long)&tokenVal.field_2 + 8));
      if (sVar10 == 0) {
        operator=(this,(UniValue *)&top_5);
      }
      else {
        ppUVar9 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::back
                            ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                             ((long)&tokenVal.field_2 + 8));
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                  (&(*ppUVar9)->values,(value_type *)&top_5);
        bVar5 = true;
      }
      ~UniValue((UniValue *)&top_5);
      break;
    case JTOK_STRING:
      if (bVar1) {
        ppUVar9 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::back
                            ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                             ((long)&tokenVal.field_2 + 8));
        tmpVal_3.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *ppUVar9;
        cfd::core::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&(tmpVal_3.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage)->keys,(value_type *)&tok
                   );
        bVar4 = true;
        bVar1 = false;
      }
      else {
        UniValue((UniValue *)&top_7,VSTR,(string *)&tok);
        sVar10 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::size
                           ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                            ((long)&tokenVal.field_2 + 8));
        if (sVar10 != 0) {
          ppUVar9 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::back
                              ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                               ((long)&tokenVal.field_2 + 8));
          std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                    (&(*ppUVar9)->values,(value_type *)&top_7);
        }
        else {
          operator=(this,(UniValue *)&top_7);
        }
        ~UniValue((UniValue *)&top_7);
        if (sVar10 == 0) break;
      }
      bVar5 = true;
      break;
    default:
      this_local._7_1_ = 0;
      goto LAB_00648246;
    }
    bVar11 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::empty
                       ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                        ((long)&tokenVal.field_2 + 8));
    local_70 = jVar7;
  } while (((bVar11 ^ 0xffU) & 1) != 0);
  jVar7 = getJsonToken((string *)&tok,(uint *)&last_tok,(char *)size_local,end_00);
  if (jVar7 == JTOK_NONE) {
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00648246:
  std::__cxx11::string::~string((string *)&tok);
  std::vector<UniValue_*,_std::allocator<UniValue_*>_>::~vector
            ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)((long)&tokenVal.field_2 + 8));
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),this_local._7_1_);
}

Assistant:

bool UniValue::read(const char *raw, size_t size)
{
    clear();

    uint32_t expectMask = 0;
    std::vector<UniValue*> stack;

    std::string tokenVal;
    unsigned int consumed;
    enum jtokentype tok = JTOK_NONE;
    enum jtokentype last_tok = JTOK_NONE;
    const char* end = raw + size;
    do {
        last_tok = tok;

        tok = getJsonToken(tokenVal, consumed, raw, end);
        if (tok == JTOK_NONE || tok == JTOK_ERR)
            return false;
        raw += consumed;

        bool isValueOpen = jsonTokenIsValue(tok) ||
            tok == JTOK_OBJ_OPEN || tok == JTOK_ARR_OPEN;

        if (expect(VALUE)) {
            if (!isValueOpen)
                return false;
            clearExpect(VALUE);

        } else if (expect(ARR_VALUE)) {
            bool isArrValue = isValueOpen || (tok == JTOK_ARR_CLOSE);
            if (!isArrValue)
                return false;

            clearExpect(ARR_VALUE);

        } else if (expect(OBJ_NAME)) {
            bool isObjName = (tok == JTOK_OBJ_CLOSE || tok == JTOK_STRING);
            if (!isObjName)
                return false;

        } else if (expect(COLON)) {
            if (tok != JTOK_COLON)
                return false;
            clearExpect(COLON);

        } else if (!expect(COLON) && (tok == JTOK_COLON)) {
            return false;
        }

        if (expect(NOT_VALUE)) {
            if (isValueOpen)
                return false;
            clearExpect(NOT_VALUE);
        }

        switch (tok) {

        case JTOK_OBJ_OPEN:
        case JTOK_ARR_OPEN: {
            VType utyp = (tok == JTOK_OBJ_OPEN ? VOBJ : VARR);
            if (!stack.size()) {
                if (utyp == VOBJ)
                    setObject();
                else
                    setArray();
                stack.push_back(this);
            } else {
                UniValue tmpVal(utyp);
                UniValue *top = stack.back();
                top->values.push_back(tmpVal);

                UniValue *newTop = &(top->values.back());
                stack.push_back(newTop);
            }

            if (utyp == VOBJ)
                setExpect(OBJ_NAME);
            else
                setExpect(ARR_VALUE);
            break;
            }

        case JTOK_OBJ_CLOSE:
        case JTOK_ARR_CLOSE: {
            if (!stack.size() || (last_tok == JTOK_COMMA))
                return false;

            VType utyp = (tok == JTOK_OBJ_CLOSE ? VOBJ : VARR);
            UniValue *top = stack.back();
            if (utyp != top->getType())
                return false;

            stack.pop_back();
            clearExpect(OBJ_NAME);
            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_COLON: {
            if (!stack.size())
                return false;

            UniValue *top = stack.back();
            if (top->getType() != VOBJ)
                return false;

            setExpect(VALUE);
            break;
            }

        case JTOK_COMMA: {
            if (!stack.size() ||
                (last_tok == JTOK_COMMA) || (last_tok == JTOK_ARR_OPEN))
                return false;

            UniValue *top = stack.back();
            if (top->getType() == VOBJ)
                setExpect(OBJ_NAME);
            else
                setExpect(ARR_VALUE);
            break;
            }

        case JTOK_KW_NULL:
        case JTOK_KW_TRUE:
        case JTOK_KW_FALSE: {
            UniValue tmpVal;
            switch (tok) {
            case JTOK_KW_NULL:
                // do nothing more
                break;
            case JTOK_KW_TRUE:
                tmpVal.setBool(true);
                break;
            case JTOK_KW_FALSE:
                tmpVal.setBool(false);
                break;
            default: /* impossible */ break;
            }

            if (!stack.size()) {
                *this = tmpVal;
                break;
            }

            UniValue *top = stack.back();
            top->values.push_back(tmpVal);

            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_NUMBER: {
            UniValue tmpVal(VNUM, tokenVal);
            if (!stack.size()) {
                *this = tmpVal;
                break;
            }

            UniValue *top = stack.back();
            top->values.push_back(tmpVal);

            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_STRING: {
            if (expect(OBJ_NAME)) {
                UniValue *top = stack.back();
                top->keys.push_back(tokenVal);
                clearExpect(OBJ_NAME);
                setExpect(COLON);
            } else {
                UniValue tmpVal(VSTR, tokenVal);
                if (!stack.size()) {
                    *this = tmpVal;
                    break;
                }
                UniValue *top = stack.back();
                top->values.push_back(tmpVal);
            }

            setExpect(NOT_VALUE);
            break;
            }

        default:
            return false;
        }
    } while (!stack.empty ());

    /* Check that nothing follows the initial construct (parsed above).  */
    tok = getJsonToken(tokenVal, consumed, raw, end);
    if (tok != JTOK_NONE)
        return false;

    return true;
}